

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_start(Context *ctx,char *profilestr)

{
  char *pcVar1;
  Buffer *pBVar2;
  undefined8 uVar3;
  
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if (ctx->mainfn == (char *)0x0) {
      pcVar1 = (char *)(*ctx->malloc)(0xf,ctx->malloc_data);
      if (pcVar1 == (char *)0x0) goto LAB_0010d56a;
      builtin_strncpy(pcVar1 + 7,"tShader",8);
      uVar3 = 0x746e656d67617246;
LAB_0010d553:
      *(undefined8 *)pcVar1 = uVar3;
      goto LAB_0010d577;
    }
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      failf(ctx,"Shader type %u unsupported in this profile.");
      return;
    }
    if (ctx->mainfn == (char *)0x0) {
      pcVar1 = (char *)(*ctx->malloc)(0xd,ctx->malloc_data);
      if (pcVar1 != (char *)0x0) {
        builtin_strncpy(pcVar1 + 5,"xShader",8);
        uVar3 = 0x6853786574726556;
        goto LAB_0010d553;
      }
LAB_0010d56a:
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
LAB_0010d577:
      ctx->mainfn = pcVar1;
    }
  }
  pBVar2 = ctx->mainline;
  if (pBVar2 == (Buffer *)0x0) {
    pBVar2 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->mainline = pBVar2;
    if (pBVar2 == (Buffer *)0x0) goto LAB_0010d5b5;
  }
  ctx->output = pBVar2;
LAB_0010d5b5:
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    if (!ctx->mainfn)
    {
        if (shader_is_vertex(ctx))
            ctx->mainfn = StrDup(ctx, "VertexShader");
        else if (shader_is_pixel(ctx))
            ctx->mainfn = StrDup(ctx, "FragmentShader");
    } // if

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}